

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_sub_module_remove_devs_augs(lys_module *module)

{
  uint uVar1;
  lys_include *plVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (module->deviation_size != '\0') {
    lVar5 = 0;
    uVar6 = 0;
    do {
      remove_dev((lys_deviation *)((long)&module->deviation->target_name + lVar5),module);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x38;
    } while (uVar6 < module->deviation_size);
  }
  if (module->augment_size != '\0') {
    lVar5 = 0;
    uVar6 = 0;
    do {
      remove_aug((lys_node_augment *)(module->augment->padding + lVar5 + -0x1c));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x68;
    } while (uVar6 < module->augment_size);
  }
  if (module->inc_size != '\0') {
    plVar2 = module->inc;
    bVar3 = 0;
    do {
      uVar1 = (uint)bVar3;
      lVar5 = *(long *)(plVar2->rev + ((ulong)(uVar1 * 0x30) - 8));
      if (lVar5 == 0) {
        return;
      }
      if (*(char *)(lVar5 + 0x49) != '\0') {
        lVar4 = 0;
        uVar6 = 0;
        do {
          remove_dev((lys_deviation *)(*(long *)(lVar5 + 0x88) + lVar4),module);
          uVar6 = uVar6 + 1;
          plVar2 = module->inc;
          lVar5 = *(long *)(plVar2->rev + ((ulong)(uVar1 * 0x30) - 8));
          lVar4 = lVar4 + 0x38;
        } while (uVar6 < *(byte *)(lVar5 + 0x49));
      }
      if (*(char *)(lVar5 + 0x48) != '\0') {
        lVar4 = 0;
        uVar6 = 0;
        do {
          remove_aug((lys_node_augment *)(*(long *)(lVar5 + 0x80) + lVar4));
          uVar6 = uVar6 + 1;
          plVar2 = module->inc;
          lVar5 = *(long *)(plVar2->rev + ((ulong)(uVar1 * 0x30) - 8));
          lVar4 = lVar4 + 0x68;
        } while (uVar6 < *(byte *)(lVar5 + 0x48));
      }
      bVar3 = bVar3 + 1;
    } while (bVar3 < module->inc_size);
  }
  return;
}

Assistant:

void
lys_sub_module_remove_devs_augs(struct lys_module *module)
{
    uint8_t u, v;

    /* remove applied deviations */
    for (u = 0; u < module->deviation_size; ++u) {
        remove_dev(&module->deviation[u], module);
    }
    /* remove applied augments */
    for (u = 0; u < module->augment_size; ++u) {
        remove_aug(&module->augment[u]);
    }

    /* remove deviation and augments defined in submodules */
    for (v = 0; v < module->inc_size && module->inc[v].submodule; ++v) {
        for (u = 0; u < module->inc[v].submodule->deviation_size; ++u) {
            remove_dev(&module->inc[v].submodule->deviation[u], module);
        }

        for (u = 0; u < module->inc[v].submodule->augment_size; ++u) {
            remove_aug(&module->inc[v].submodule->augment[u]);
        }
    }
}